

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,int>>::emplace<QString_const&,int&>
          (QMovableArrayOps<std::pair<QString,_int>_> *this,qsizetype i,QString *args,int *args_1)

{
  bool bVar1;
  qsizetype qVar2;
  pair<QString,_int> *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  pair<QString,_int> tmp;
  pair<QString,_int> *in_stack_ffffffffffffff58;
  Inserter *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar3;
  GrowthPosition in_stack_ffffffffffffff7c;
  QArrayDataPointer<std::pair<QString,_int>_> *in_stack_ffffffffffffff80;
  Inserter local_50;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<std::pair<QString,_int>_>::needsDetach
                    ((QArrayDataPointer<std::pair<QString,_int>_> *)in_stack_ffffffffffffff60);
  if (!bVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar2 = QArrayDataPointer<std::pair<QString,_int>_>::freeSpaceAtEnd
                          ((QArrayDataPointer<std::pair<QString,_int>_> *)
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)),
       qVar2 != 0)) {
      QArrayDataPointer<std::pair<QString,_int>_>::end
                ((QArrayDataPointer<std::pair<QString,_int>_> *)in_stack_ffffffffffffff60);
      std::pair<QString,_int>::pair<int_&,_true>
                ((pair<QString,_int> *)in_RDI,
                 (QString *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                 (int *)in_stack_ffffffffffffff60);
      in_RDI->displaceTo = (pair<QString,_int> *)((long)&(in_RDI->displaceTo->first).d.d + 1);
      goto LAB_008beb54;
    }
    if ((in_RSI == (pair<QString,_int> *)0x0) &&
       (qVar2 = QArrayDataPointer<std::pair<QString,_int>_>::freeSpaceAtBegin
                          ((QArrayDataPointer<std::pair<QString,_int>_> *)
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)),
       qVar2 != 0)) {
      QArrayDataPointer<std::pair<QString,_int>_>::begin
                ((QArrayDataPointer<std::pair<QString,_int>_> *)0x8be9b4);
      std::pair<QString,_int>::pair<int_&,_true>
                ((pair<QString,_int> *)in_RDI,
                 (QString *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                 (int *)in_stack_ffffffffffffff60);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (pair<QString,_int> *)((long)&(in_RDI->displaceTo->first).d.d + 1);
      goto LAB_008beb54;
    }
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  std::pair<QString,_int>::pair<int_&,_true>
            ((pair<QString,_int> *)in_RDI,
             (QString *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             (int *)in_stack_ffffffffffffff60);
  bVar1 = in_RDI->displaceTo != (pair<QString,_int> *)0x0;
  uVar3 = bVar1 && in_RSI == (pair<QString,_int> *)0x0;
  QArrayDataPointer<std::pair<QString,_int>_>::detachAndGrow
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(qsizetype)in_RDI,
             (pair<QString,_int> **)CONCAT17(uVar3,in_stack_ffffffffffffff68),
             (QArrayDataPointer<std::pair<QString,_int>_> *)in_stack_ffffffffffffff60);
  if (bVar1 && in_RSI == (pair<QString,_int> *)0x0) {
    QArrayDataPointer<std::pair<QString,_int>_>::begin
              ((QArrayDataPointer<std::pair<QString,_int>_> *)0x8beaa4);
    std::pair<QString,_int>::pair
              ((pair<QString,_int> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (pair<QString,_int> *)((long)&(in_RDI->displaceTo->first).d.d + 1);
  }
  else {
    QMovableArrayOps<std::pair<QString,_int>_>::Inserter::Inserter
              (in_RDI,(QArrayDataPointer<std::pair<QString,_int>_> *)
                      CONCAT17(uVar3,in_stack_ffffffffffffff68),(qsizetype)in_stack_ffffffffffffff60
               ,(qsizetype)in_stack_ffffffffffffff58);
    QMovableArrayOps<std::pair<QString,_int>_>::Inserter::insertOne
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    QMovableArrayOps<std::pair<QString,_int>_>::Inserter::~Inserter(&local_50);
  }
  std::pair<QString,_int>::~pair((pair<QString,_int> *)0x8beb54);
LAB_008beb54:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }